

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                  parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int *local_a8;
  int local_a0;
  int NWH;
  int F_ext;
  int F_opn;
  int E_ext;
  int E_opn;
  int H_dag;
  int E;
  int WH;
  int NH;
  int *matrow;
  int local_68;
  int j;
  int i;
  int s1Len;
  int *F;
  int *H;
  int *s2;
  int *s1;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  
  s2 = (int *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_a0 = _s1Len;
    if (matrix->type != 0) {
      local_a0 = matrix->length;
    }
    _s1_local = (char *)parasail_result_new_rowcol1(local_a0,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x1400101;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40000;
      ptr = parasail_memalign_int(0x10,(long)s2Len);
      ptr_00 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign_int(0x10,(long)(s2Len + 1));
      if (ptr == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        if (matrix->type == 0) {
          s2 = parasail_memalign_int(0x10,(long)local_a0);
          if (s2 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          for (local_68 = 0; local_68 < local_a0; local_68 = local_68 + 1) {
            s2[local_68] = matrix->mapper[(byte)_s1[local_68]];
          }
        }
        for (matrow._4_4_ = 0; matrow._4_4_ < s2Len; matrow._4_4_ = matrow._4_4_ + 1) {
          ptr[matrow._4_4_] = matrix->mapper[(byte)_s2[matrow._4_4_]];
        }
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        for (matrow._4_4_ = 1; matrow._4_4_ <= s2Len; matrow._4_4_ = matrow._4_4_ + 1) {
          ptr_00[matrow._4_4_] = -((matrow._4_4_ + -1) * gap) - open;
          ptr_01[matrow._4_4_] = -0x40000000;
        }
        for (local_68 = 1; local_68 <= local_a0; local_68 = local_68 + 1) {
          if (matrix->type == 0) {
            local_a8 = matrix->matrix + matrix->size * s2[local_68 + -1];
          }
          else {
            local_a8 = matrix->matrix + matrix->size * (local_68 + -1);
          }
          E = *ptr_00;
          H_dag = -((local_68 + -1) * gap) - open;
          E_opn = -0x40000000;
          *ptr_00 = H_dag;
          for (matrow._4_4_ = 1; matrow._4_4_ <= s2Len; matrow._4_4_ = matrow._4_4_ + 1) {
            iVar1 = ptr_00[matrow._4_4_];
            iVar2 = iVar1 - open;
            local_ac = ptr_01[matrow._4_4_] - gap;
            if (local_ac < iVar2) {
              local_ac = iVar2;
            }
            ptr_01[matrow._4_4_] = local_ac;
            local_b0 = E_opn - gap;
            if (local_b0 < H_dag - open) {
              local_b0 = H_dag - open;
            }
            E_opn = local_b0;
            local_b4 = E + local_a8[ptr[matrow._4_4_ + -1]];
            if (local_b4 <= local_b0) {
              local_b4 = local_b0;
            }
            if (ptr_01[matrow._4_4_] < local_b4) {
              local_b8 = local_b4;
            }
            else {
              local_b8 = ptr_01[matrow._4_4_];
            }
            H_dag = local_b8;
            ptr_00[matrow._4_4_] = local_b8;
            E = iVar1;
          }
          ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_col[local_68 + -1] = H_dag;
        }
        for (matrow._4_4_ = 1; matrow._4_4_ <= s2Len; matrow._4_4_ = matrow._4_4_ + 1) {
          ((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row[matrow._4_4_ + -1] =
               ptr_00[matrow._4_4_];
        }
        ((parasail_result_t *)_s1_local)->score = ptr_00[s2Len];
        ((parasail_result_t *)_s1_local)->end_query = local_a0 + -1;
        ((parasail_result_t *)_s1_local)->end_ref = s2Len + -1;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open -(j-1)*gap;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->rowcols->score_row[j-1] = H[j];
    }
#endif

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}